

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.h
# Opt level: O0

uint8_t * icu_63::BytesTrie::skipValue(uint8_t *pos)

{
  uint8_t *puVar1;
  int32_t leadByte;
  uint8_t *pos_local;
  
  puVar1 = skipValue(pos + 1,(uint)*pos);
  return puVar1;
}

Assistant:

static inline const uint8_t *skipValue(const uint8_t *pos) {
        int32_t leadByte=*pos++;
        return skipValue(pos, leadByte);
    }